

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O0

void __thiscall FIX::message_order::message_order(message_order *this,int *order)

{
  int local_1c;
  int size;
  int *order_local;
  message_order *this_local;
  
  this->m_mode = group;
  this->m_delim = 0;
  shared_array<int>::shared_array(&this->m_groupOrder);
  this->m_largest = 0;
  for (local_1c = 0; order[local_1c] != 0; local_1c = local_1c + 1) {
  }
  setOrder(this,local_1c,order);
  return;
}

Assistant:

message_order::message_order( const int order[] )
: m_mode( group ), m_delim( 0 ), m_largest( 0 )
{
  int size = 0;
  while( order[size] != 0 ) { ++size; }
  setOrder(size, order);
}